

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

void hiberlite::Database::dbDeleteRows<long_long>
               (shared_connection *con,string *table,string *column,longlong value)

{
  string local_148 [32];
  shared_res<hiberlite::autoclosed_con> local_128;
  Transformer local_118 [48];
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string query;
  longlong local_28;
  longlong value_local;
  string *column_local;
  string *table_local;
  shared_connection *con_local;
  
  local_28 = value;
  value_local = (longlong)column;
  column_local = table;
  table_local = (string *)con;
  std::operator+((char *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"DELETE FROM "
                );
  std::operator+(local_c8,(char *)local_e8);
  std::operator+(local_a8,local_c8);
  std::operator+(local_88,(char *)local_a8);
  Transformer::toSQLiteValue_abi_cxx11_(local_118,&local_28);
  std::operator+(local_68,local_88);
  std::operator+(local_48,(char *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_128,con);
  std::__cxx11::string::string(local_148,(string *)local_48);
  dbExecQuery(&local_128,(string *)local_148);
  std::__cxx11::string::~string(local_148);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_128);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Database::dbDeleteRows(shared_connection con, std::string table, std::string column, C value )
{
	std::string query="DELETE FROM "+table
					+ " WHERE "+column+"="+Transformer::toSQLiteValue(value)+";";
	dbExecQuery(con,query);
}